

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * __thiscall CGL::Matrix3x3::operator*(Matrix3x3 *this,double c)

{
  Vector3D *pVVar1;
  Matrix3x3 *in_RSI;
  Matrix3x3 *in_RDI;
  Matrix3x3 *A;
  Matrix3x3 *B;
  Matrix3x3 *c_00;
  Vector3D *in_stack_ffffffffffffff78;
  double local_80;
  double local_78;
  undefined8 local_70;
  double local_68;
  Matrix3x3 *in_stack_ffffffffffffffa0;
  double local_58;
  undefined8 local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined8 local_30;
  
  c_00 = in_RDI;
  Matrix3x3(in_stack_ffffffffffffffa0);
  operator[](in_RSI,0);
  Vector3D::operator*(in_stack_ffffffffffffff78,(double *)c_00);
  pVVar1 = operator[](in_RDI,0);
  (pVVar1->field_0).field_0.x = local_48;
  (pVVar1->field_0).field_0.y = local_40;
  (pVVar1->field_0).field_0.z = local_38;
  *(undefined8 *)((long)&pVVar1->field_0 + 0x18) = local_30;
  operator[](in_RSI,1);
  Vector3D::operator*(in_stack_ffffffffffffff78,(double *)c_00);
  pVVar1 = operator[](in_RDI,1);
  (pVVar1->field_0).field_0.x = local_68;
  (pVVar1->field_0).field_0.y = (double)in_stack_ffffffffffffffa0;
  (pVVar1->field_0).field_0.z = local_58;
  *(undefined8 *)((long)&pVVar1->field_0 + 0x18) = local_50;
  operator[](in_RSI,2);
  Vector3D::operator*(in_stack_ffffffffffffff78,(double *)c_00);
  pVVar1 = operator[](in_RDI,2);
  (pVVar1->field_0).field_0.x = (double)in_stack_ffffffffffffff78;
  (pVVar1->field_0).field_0.y = local_80;
  (pVVar1->field_0).field_0.z = local_78;
  *(undefined8 *)((long)&pVVar1->field_0 + 0x18) = local_70;
  return c_00;
}

Assistant:

Matrix3x3 Matrix3x3::operator*( double c ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    B[0] = A[0] * c;
    B[1] = A[1] * c;
    B[2] = A[2] * c;

    return B;
  }